

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ArrayInputStream::Next(ArrayInputStream *this,void **data,int *size)

{
  bool bVar1;
  int *piVar2;
  int local_2c;
  int *local_28;
  int *size_local;
  void **data_local;
  ArrayInputStream *this_local;
  
  bVar1 = this->size_ <= this->position_;
  if (bVar1) {
    this->last_returned_size_ = 0;
  }
  else {
    local_2c = this->size_ - this->position_;
    local_28 = size;
    size_local = (int *)data;
    data_local = (void **)this;
    piVar2 = std::min<int>(&this->block_size_,&local_2c);
    this->last_returned_size_ = *piVar2;
    *(uint8 **)size_local = this->data_ + this->position_;
    *local_28 = this->last_returned_size_;
    this->position_ = this->last_returned_size_ + this->position_;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool ArrayInputStream::Next(const void** data, int* size) {
  if (position_ < size_) {
    last_returned_size_ = min(block_size_, size_ - position_);
    *data = data_ + position_;
    *size = last_returned_size_;
    position_ += last_returned_size_;
    return true;
  } else {
    // We're at the end of the array.
    last_returned_size_ = 0;   // Don't let caller back up.
    return false;
  }
}